

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_WiningStateTest_BonusTiles_Multiple_TestShell::createTest
          (TEST_WiningStateTest_BonusTiles_Multiple_TestShell *this)

{
  TEST_WiningStateTest_BonusTiles_Multiple_Test *this_00;
  
  this_00 = (TEST_WiningStateTest_BonusTiles_Multiple_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                         ,0xed);
  TEST_WiningStateTest_BonusTiles_Multiple_Test::TEST_WiningStateTest_BonusTiles_Multiple_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(WiningStateTest, BonusTiles_Multiple)
{
	addPair(Tile::OneOfBamboos);
	addSequence(Tile::TwoOfBamboos);
	addSequence(Tile::ThreeOfCharacters);
	addTriplet(Tile::SixOfCircles);
	addSequence(Tile::SevenOfCharacters);

	s.addBonusTile(Tile::OneOfBamboos);	
	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::OneOfBamboos);	
	
	selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::SelfDrawn));
	CHECK_EQUAL(8, r.bonus_tile_count);
	CHECK_EQUAL(9, r.doubling_factor);
}